

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::setBasis(Highs *this,HighsBasis *basis,string *origin)

{
  HighsModel *lp;
  pointer pcVar1;
  pointer pHVar2;
  pointer pHVar3;
  bool bVar4;
  bool bVar5;
  HighsInt HVar6;
  bool bVar7;
  HighsStatus HVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  HighsBasisStatus HVar12;
  HighsBasis modifiable_basis;
  HighsLpSolverObject solver_object;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 uVar13;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [16];
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_a8;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_90;
  HighsLpSolverObject local_78;
  
  uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  lp = &this->model_;
  if (basis->alien != true) {
    bVar7 = isBasisConsistent(&lp->lp_,basis);
    if (!bVar7) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "setBasis: invalid basis\n");
      return kError;
    }
    (this->basis_).debug_update_count = basis->debug_update_count;
    bVar7 = basis->alien;
    bVar4 = basis->useful;
    bVar5 = basis->was_alien;
    HVar6 = basis->debug_id;
    (this->basis_).valid = basis->valid;
    (this->basis_).alien = bVar7;
    (this->basis_).useful = bVar4;
    (this->basis_).was_alien = bVar5;
    (this->basis_).debug_id = HVar6;
    std::__cxx11::string::_M_assign((string *)&(this->basis_).debug_origin_name);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
              (&(this->basis_).col_status,&basis->col_status);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
              (&(this->basis_).row_status,&basis->row_status);
    goto LAB_0020da76;
  }
  if ((this->model_).lp_.num_row_ == 0) {
    lVar10 = (long)(lp->lp_).num_col_;
    if (0 < lVar10) {
      pHVar2 = (basis->col_status).
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start;
      pHVar3 = (this->basis_).col_status.
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        HVar12 = pHVar2[lVar11];
        if (HVar12 == kBasic) {
          HVar12 = kNonbasic;
        }
        pHVar3[lVar11] = HVar12;
        lVar11 = lVar11 + 1;
      } while (lVar10 != lVar11);
    }
    (this->basis_).alien = false;
    goto LAB_0020da76;
  }
  bVar7 = isBasisRightSize(&lp->lp_,basis);
  if (!bVar7) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "setBasis: User basis is rejected due to mismatch between size of column and row status vectors (%d, %d) and number of columns and rows in the model (%d, %d)\n"
                 ,(ulong)(uint)(*(int *)&(this->basis_).col_status.
                                         super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                               *(int *)&(this->basis_).col_status.
                                        super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                        ._M_impl.super__Vector_impl_data._M_start),
                 (ulong)(uint)(*(int *)&(this->basis_).row_status.
                                        super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                              *(int *)&(this->basis_).row_status.
                                       super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                       ._M_impl.super__Vector_impl_data._M_start),
                 (ulong)(uint)(this->model_).lp_.num_col_,
                 CONCAT44(uVar13,(this->model_).lp_.num_row_));
    return kError;
  }
  local_d8._8_4_ = basis->debug_update_count;
  local_d8._0_8_ = *(undefined8 *)basis;
  local_c8._M_allocated_capacity = (size_type)local_b8;
  pcVar1 = (basis->debug_origin_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_d8 + 0x10),pcVar1,pcVar1 + (basis->debug_origin_name)._M_string_length
            );
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector
            (&local_a8,&basis->col_status);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector
            (&local_90,&basis->row_status);
  local_78.basis_ = (HighsBasis *)local_d8;
  local_d8[3] = 1;
  local_78.solution_ = &this->solution_;
  local_78.highs_info_ = &this->info_;
  local_78.ekk_instance_ = &this->ekk_instance_;
  local_78.callback_ = &this->callback_;
  local_78.options_ = &this->options_;
  local_78.timer_ = &this->timer_;
  local_78.model_status_ = kMin;
  local_78.lp_ = &lp->lp_;
  HVar8 = formSimplexLpBasisAndFactor(&local_78,false);
  if (HVar8 == kOk) {
    (this->basis_).debug_update_count = local_d8._8_4_;
    (this->basis_).valid = (bool)local_d8[0];
    (this->basis_).alien = (bool)local_d8[1];
    (this->basis_).useful = (bool)local_d8[2];
    (this->basis_).was_alien = (bool)local_d8[3];
    (this->basis_).debug_id = local_d8._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->basis_).debug_origin_name,(string *)(local_d8 + 0x10));
    pHVar2 = (this->basis_).col_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->basis_).col_status.
    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_a8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->basis_).col_status.
    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->basis_).col_status.
    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_a8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pHVar2 != (pointer)0x0) {
      operator_delete(pHVar2);
    }
    pHVar2 = (this->basis_).row_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->basis_).row_status.
    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->basis_).row_status.
    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->basis_).row_status.
    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pHVar2 != (pointer)0x0) {
      operator_delete(pHVar2);
      goto LAB_0020d986;
    }
  }
  else {
LAB_0020d986:
    if (local_90.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_a8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_c8._M_allocated_capacity != local_b8) {
    operator_delete((void *)local_c8._M_allocated_capacity);
  }
  if (HVar8 != kOk) {
    return kError;
  }
LAB_0020da76:
  (this->basis_).valid = true;
  (this->basis_).useful = true;
  iVar9 = std::__cxx11::string::compare((char *)origin);
  if (iVar9 != 0) {
    std::__cxx11::string::_M_assign((string *)&(this->basis_).debug_origin_name);
  }
  if ((this->basis_).was_alien == true) {
    highsBoolToString_abi_cxx11_((string *)local_d8,true,2);
    highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                "Highs::setBasis Was alien = %-5s; Id = %9d; UpdateCount = %4d; Origin (%s)\n",
                local_d8._0_8_,(ulong)(uint)(this->basis_).debug_id,
                (ulong)(uint)(this->basis_).debug_update_count,
                (this->basis_).debug_origin_name._M_dataplus._M_p);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_);
    }
  }
  HEkk::updateStatus(&this->ekk_instance_,kNewBasis);
  return kOk;
}

Assistant:

HighsStatus Highs::setBasis(const HighsBasis& basis,
                            const std::string& origin) {
  if (basis.alien) {
    // An alien basis needs to be checked properly, since it may be
    // singular, or even incomplete.
    if (model_.lp_.num_row_ == 0) {
      // Special case where there are no rows, so no singularity
      // issues. All columns with basic status must be set nonbasic
      for (HighsInt iCol = 0; iCol < model_.lp_.num_col_; iCol++)
        basis_.col_status[iCol] =
            basis.col_status[iCol] == HighsBasisStatus::kBasic
                ? HighsBasisStatus::kNonbasic
                : basis.col_status[iCol];
      basis_.alien = false;
    } else {
      // Check whether a new basis can be defined
      if (!isBasisRightSize(model_.lp_, basis)) {
        highsLogUser(
            options_.log_options, HighsLogType::kError,
            "setBasis: User basis is rejected due to mismatch between "
            "size of column and row status vectors (%d, %d) and number "
            "of columns and rows in the model (%d, %d)\n",
            int(basis_.col_status.size()), int(basis_.row_status.size()),
            int(model_.lp_.num_col_), int(model_.lp_.num_row_));
        return HighsStatus::kError;
      }
      HighsBasis modifiable_basis = basis;
      modifiable_basis.was_alien = true;
      HighsLpSolverObject solver_object(model_.lp_, modifiable_basis, solution_,
                                        info_, ekk_instance_, callback_,
                                        options_, timer_);
      HighsStatus return_status = formSimplexLpBasisAndFactor(solver_object);
      if (return_status != HighsStatus::kOk) return HighsStatus::kError;
      // Update the HiGHS basis
      basis_ = std::move(modifiable_basis);
    }
  } else {
    // Check the user-supplied basis
    if (!isBasisConsistent(model_.lp_, basis)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "setBasis: invalid basis\n");
      return HighsStatus::kError;
    }
    // Update the HiGHS basis
    basis_ = basis;
  }
  basis_.valid = true;
  basis_.useful = true;
  if (origin != "") basis_.debug_origin_name = origin;
  assert(basis_.debug_origin_name != "");
  assert(!basis_.alien);
  if (basis_.was_alien) {
    highsLogDev(
        options_.log_options, HighsLogType::kInfo,
        "Highs::setBasis Was alien = %-5s; Id = %9d; UpdateCount = %4d; Origin "
        "(%s)\n",
        highsBoolToString(basis_.was_alien).c_str(), (int)basis_.debug_id,
        (int)basis_.debug_update_count, basis_.debug_origin_name.c_str());
  }

  // Follow implications of a new HiGHS basis
  newHighsBasis();
  // Can't use returnFromHighs since...
  return HighsStatus::kOk;
}